

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_test.cpp
# Opt level: O0

void PrintTreeWith1Level(BPlusTree *bplustree)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ostream *poVar2;
  ulong uVar3;
  element_type *peVar4;
  size_type sVar5;
  shared_ptr<Node> local_68;
  undefined1 local_58 [8];
  shared_ptr<Node> itr;
  undefined1 local_40 [4];
  int i;
  undefined1 local_20 [8];
  shared_ptr<Node> root;
  BPlusTree *bplustree_local;
  
  root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)bplustree;
  BPlusTree::GetRoot((BPlusTree *)local_20);
  poVar2 = std::operator<<((ostream *)&std::cerr,"Root Node: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  _Var1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<Node>::shared_ptr((shared_ptr<Node> *)local_40,(shared_ptr<Node> *)local_20);
  BPlusTree::PrintNode((BPlusTree *)_Var1._M_pi,(shared_ptr<Node> *)local_40);
  std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_40);
  itr.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
  while( true ) {
    uVar3 = (ulong)itr.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
    peVar4 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_20);
    sVar5 = std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::size
                      (&peVar4->ptrs);
    if (sVar5 <= uVar3) break;
    peVar4 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_20);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::operator[]
              (&peVar4->ptrs,
               (long)itr.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                     _4_4_);
    std::static_pointer_cast<Node,void>((shared_ptr<void> *)local_58);
    poVar2 = std::operator<<((ostream *)&std::cerr,"level 1 node: ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    _Var1 = root.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<Node>::shared_ptr(&local_68,(shared_ptr<Node> *)local_58);
    BPlusTree::PrintNode((BPlusTree *)_Var1._M_pi,&local_68);
    std::shared_ptr<Node>::~shared_ptr(&local_68);
    std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_58);
    itr.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         itr.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ + 1;
  }
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_20);
  return;
}

Assistant:

void PrintTreeWith1Level(BPlusTree& bplustree) {
	std::shared_ptr<Node> root = bplustree.GetRoot();
	std::cerr << "Root Node: " << std::endl;
	bplustree.PrintNode(root);

	for (int i = 0; i < root->ptrs.size(); i++) {
		std::shared_ptr<Node> itr = std::static_pointer_cast<Node>(root->ptrs[i]);
		std::cerr << "level 1 node: " << std::endl;
		bplustree.PrintNode(itr);
	}
	std::cerr << std::endl;
}